

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O1

mg_value * mg_value_copy_ca(mg_value *val,mg_allocator *allocator)

{
  mg_node *pmVar1;
  mg_unbound_relationship **ppmVar2;
  mg_value *buf;
  mg_path *pmVar3;
  mg_path *pmVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  undefined4 uVar8;
  
  if ((val == (mg_value *)0x0) ||
     (buf = (mg_value *)mg_allocator_malloc(allocator,0x10), buf == (mg_value *)0x0))
  goto LAB_00109ace;
  buf->type = val->type;
  switch(val->type) {
  case MG_VALUE_TYPE_BOOL:
    (buf->field_1).bool_v = (val->field_1).bool_v;
    return buf;
  case MG_VALUE_TYPE_INTEGER:
    buf->field_1 = val->field_1;
    return buf;
  case MG_VALUE_TYPE_FLOAT:
    buf->field_1 = val->field_1;
    return buf;
  case MG_VALUE_TYPE_STRING:
    pmVar3 = (mg_path *)mg_string_copy_ca((val->field_1).string_v,allocator);
    break;
  case MG_VALUE_TYPE_LIST:
    pmVar3 = (mg_path *)mg_list_copy_ca((val->field_1).list_v,allocator);
    break;
  case MG_VALUE_TYPE_MAP:
    pmVar3 = (mg_path *)mg_map_copy_ca((val->field_1).map_v,allocator);
    break;
  case MG_VALUE_TYPE_NODE:
    pmVar3 = (mg_path *)mg_node_copy_ca((val->field_1).node_v,allocator);
    break;
  case MG_VALUE_TYPE_RELATIONSHIP:
    pmVar3 = (mg_path *)mg_relationship_copy_ca((val->field_1).relationship_v,allocator);
    break;
  case MG_VALUE_TYPE_UNBOUND_RELATIONSHIP:
    pmVar3 = (mg_path *)
             mg_unbound_relationship_copy_ca((val->field_1).unbound_relationship_v,allocator);
    break;
  case MG_VALUE_TYPE_PATH:
    pmVar3 = mg_path_copy_ca((val->field_1).path_v,allocator);
    break;
  case MG_VALUE_TYPE_DATE:
  case MG_VALUE_TYPE_LOCAL_TIME:
    pmVar1 = (val->field_1).node_v;
    if ((pmVar1 == (mg_node *)0x0) ||
       (pmVar3 = (mg_path *)mg_allocator_malloc(allocator,8), pmVar3 == (mg_path *)0x0))
    goto LAB_00109ab4;
    uVar8 = *(undefined4 *)((long)&pmVar1->id + 4);
    pmVar3->node_count = *(undefined4 *)&pmVar1->id;
    pmVar3->relationship_count = uVar8;
    break;
  case MG_VALUE_TYPE_TIME:
  case MG_VALUE_TYPE_LOCAL_DATE_TIME:
    pmVar4 = (val->field_1).path_v;
    if ((pmVar4 == (mg_path *)0x0) ||
       (pmVar3 = (mg_path *)mg_allocator_malloc(allocator,0x10), pmVar3 == (mg_path *)0x0))
    goto LAB_00109ab4;
LAB_00109a81:
    uVar5 = pmVar4->node_count;
    uVar6 = pmVar4->relationship_count;
    uVar7 = pmVar4->sequence_length;
    uVar8 = *(undefined4 *)&pmVar4->field_0xc;
LAB_00109aaf:
    pmVar3->node_count = uVar5;
    pmVar3->relationship_count = uVar6;
    pmVar3->sequence_length = uVar7;
    *(undefined4 *)&pmVar3->field_0xc = uVar8;
    break;
  case MG_VALUE_TYPE_DATE_TIME:
  case MG_VALUE_TYPE_DATE_TIME_ZONE_ID:
  case MG_VALUE_TYPE_POINT_2D:
    pmVar4 = (val->field_1).path_v;
    if ((pmVar4 != (mg_path *)0x0) &&
       (pmVar3 = (mg_path *)mg_allocator_malloc(allocator,0x18), pmVar3 != (mg_path *)0x0)) {
      pmVar3->nodes = pmVar4->nodes;
      goto LAB_00109a81;
    }
    goto LAB_00109ab4;
  case MG_VALUE_TYPE_DURATION:
  case MG_VALUE_TYPE_POINT_3D:
    pmVar4 = (val->field_1).path_v;
    if ((pmVar4 != (mg_path *)0x0) &&
       (pmVar3 = (mg_path *)mg_allocator_malloc(allocator,0x20), pmVar3 != (mg_path *)0x0)) {
      uVar5 = pmVar4->node_count;
      uVar6 = pmVar4->relationship_count;
      uVar7 = pmVar4->sequence_length;
      uVar8 = *(undefined4 *)&pmVar4->field_0xc;
      ppmVar2 = pmVar4->relationships;
      pmVar3->nodes = pmVar4->nodes;
      pmVar3->relationships = ppmVar2;
      goto LAB_00109aaf;
    }
LAB_00109ab4:
    pmVar3 = (mg_path *)0x0;
    break;
  default:
    goto switchD_00109a18_default;
  }
  (buf->field_1).path_v = pmVar3;
  if (pmVar3 == (mg_path *)0x0) {
    mg_allocator_free(&mg_system_allocator,buf);
LAB_00109ace:
    buf = (mg_value *)0x0;
  }
switchD_00109a18_default:
  return buf;
}

Assistant:

mg_value *mg_value_copy_ca(const mg_value *val, mg_allocator *allocator) {
  if (!val) {
    return NULL;
  }
  mg_value *new_val = mg_allocator_malloc(allocator, sizeof(mg_value));
  if (!new_val) {
    return NULL;
  }
  new_val->type = val->type;
  switch (val->type) {
    case MG_VALUE_TYPE_NULL:
      break;
    case MG_VALUE_TYPE_BOOL:
      new_val->bool_v = val->bool_v;
      break;
    case MG_VALUE_TYPE_INTEGER:
      new_val->integer_v = val->integer_v;
      break;
    case MG_VALUE_TYPE_FLOAT:
      new_val->float_v = val->float_v;
      break;
    case MG_VALUE_TYPE_STRING:
      new_val->string_v = mg_string_copy_ca(val->string_v, allocator);
      if (!new_val->string_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_LIST:
      new_val->list_v = mg_list_copy_ca(val->list_v, allocator);
      if (!new_val->list_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_MAP:
      new_val->map_v = mg_map_copy_ca(val->map_v, allocator);
      if (!new_val->map_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_NODE:
      new_val->node_v = mg_node_copy_ca(val->node_v, allocator);
      if (!new_val->node_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_RELATIONSHIP:
      new_val->relationship_v =
          mg_relationship_copy_ca(val->relationship_v, allocator);
      if (!new_val->relationship_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_UNBOUND_RELATIONSHIP:
      new_val->unbound_relationship_v = mg_unbound_relationship_copy_ca(
          val->unbound_relationship_v, allocator);
      if (!new_val->unbound_relationship_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_PATH:
      new_val->path_v = mg_path_copy_ca(val->path_v, allocator);
      if (!new_val->path_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_DATE:
      new_val->date_v = mg_date_copy_ca(val->date_v, allocator);
      if (!new_val->date_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_TIME:
      new_val->time_v = mg_time_copy_ca(val->time_v, allocator);
      if (!new_val->time_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_LOCAL_TIME:
      new_val->local_time_v =
          mg_local_time_copy_ca(val->local_time_v, allocator);
      if (!new_val->local_time_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_DATE_TIME:
      new_val->date_time_v = mg_date_time_copy_ca(val->date_time_v, allocator);
      if (!new_val->date_time_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_DATE_TIME_ZONE_ID:
      new_val->date_time_zone_id_v =
          mg_date_time_zone_id_copy_ca(val->date_time_zone_id_v, allocator);
      if (!new_val->date_time_zone_id_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_LOCAL_DATE_TIME:
      new_val->local_date_time_v =
          mg_local_date_time_copy_ca(val->local_date_time_v, allocator);
      if (!new_val->local_date_time_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_DURATION:
      new_val->duration_v = mg_duration_copy_ca(val->duration_v, allocator);
      if (!new_val->duration_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_POINT_2D:
      new_val->point_2d_v = mg_point_2d_copy_ca(val->point_2d_v, allocator);
      if (!new_val->point_2d_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_POINT_3D:
      new_val->point_3d_v = mg_point_3d_copy_ca(val->point_3d_v, allocator);
      if (!new_val->point_3d_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_UNKNOWN:
      break;
  }
  return new_val;

cleanup:
  mg_allocator_free(&mg_system_allocator, new_val);
  return NULL;
}